

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O0

void __thiscall
GraphContigger::clip_all_tips
          (GraphContigger *this,GraphEditor *ge,PairedReadsDatastore *peds,int size,bool apply)

{
  bool bVar1;
  ostream *poVar2;
  int in_ECX;
  DistanceGraph *in_RDX;
  SequenceDistanceGraph *in_RSI;
  byte in_R8B;
  NodeView *nv;
  iterator __end1;
  iterator __begin1;
  vector<NodeView,_std::allocator<NodeView>_> *__range1;
  int solved;
  int total;
  int in_stack_00000098;
  int in_stack_0000009c;
  PairedReadsDatastore *in_stack_000000a0;
  NodeView *in_stack_000000a8;
  GraphEditor *in_stack_000000b0;
  GraphContigger *in_stack_000000b8;
  int in_stack_000000d0;
  GraphEditor *in_stack_00000460;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  vector<NodeView,_std::allocator<NodeView>_> *in_stack_ffffffffffffff80;
  __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_> local_50;
  undefined1 local_48 [24];
  undefined1 *local_30;
  int local_28;
  int local_24;
  byte local_1d;
  
  local_1d = in_R8B & 1;
  local_24 = 0;
  local_28 = 0;
  DistanceGraph::get_all_nodeviews
            (in_RDX,SUB41((uint)in_ECX >> 0x18,0),SUB41((uint)in_ECX >> 0x10,0));
  local_30 = local_48;
  local_50._M_current =
       (NodeView *)
       std::vector<NodeView,_std::allocator<NodeView>_>::begin
                 ((vector<NodeView,_std::allocator<NodeView>_> *)
                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<NodeView,_std::allocator<NodeView>_>::end
            ((vector<NodeView,_std::allocator<NodeView>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)), bVar1
        ) {
    __gnu_cxx::__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
    operator*(&local_50);
    in_stack_ffffffffffffff80 =
         (vector<NodeView,_std::allocator<NodeView>_> *)NodeView::size((NodeView *)0x4c4000);
    if ((in_stack_ffffffffffffff80 <= (vector<NodeView,_std::allocator<NodeView>_> *)(long)in_ECX)
       && (bVar1 = NodeView::is_tip(__begin1._M_current), bVar1)) {
      local_24 = local_24 + 1;
      in_stack_ffffffffffffff70 = 0;
      in_stack_ffffffffffffff68 = 10;
      bVar1 = clip_tip(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
                       in_stack_0000009c,in_stack_00000098,in_stack_000000d0,this._7_1_);
      if (bVar1) {
        local_28 = local_28 + 1;
      }
    }
    __gnu_cxx::__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
    operator++(&local_50);
  }
  std::vector<NodeView,_std::allocator<NodeView>_>::~vector(in_stack_ffffffffffffff80);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,local_28);
  poVar2 = std::operator<<(poVar2,"/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
  poVar2 = std::operator<<(poVar2," tips solved!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if ((local_1d & 1) != 0) {
    GraphEditor::apply_all(in_stack_00000460);
    SequenceDistanceGraph::join_all_unitigs(in_RSI);
  }
  return;
}

Assistant:

void GraphContigger::clip_all_tips(GraphEditor &ge, PairedReadsDatastore &peds, int size, bool apply) {
    int total=0;
    int solved=0;
    for (auto &nv: ws.sdg.get_all_nodeviews()){
        if (nv.size()<=size and nv.is_tip()){
            total++;
            if (clip_tip(ge, nv, peds)){
                solved++;
            }
        }
    }
    std::cout << solved << "/" << total << " tips solved!" << std::endl;
    if (apply) {
        ge.apply_all();
        ws.sdg.join_all_unitigs();
    }
}